

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-uname.c
# Opt level: O1

int run_test_uname(void)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  uv_loop_t *puVar2;
  uv_timer_t *puVar3;
  code *pcVar4;
  uv_timer_t *puVar5;
  utsname buf;
  uv_utsname_t buffer;
  utsname local_586;
  uv_utsname_t local_400;
  
  iVar1 = uv_os_uname((uv_utsname_t *)0x0);
  if (iVar1 == -0x16) {
    iVar1 = uv_os_uname(&local_400);
    if (iVar1 != 0) goto LAB_0017a4d7;
    iVar1 = uname(&local_586);
    if (iVar1 == -1) goto LAB_0017a4dc;
    iVar1 = strcmp(local_400.sysname,local_586.sysname);
    if (iVar1 != 0) goto LAB_0017a4e1;
    iVar1 = strcmp(local_400.version,local_586.version);
    if (iVar1 != 0) goto LAB_0017a4e6;
    iVar1 = strcmp(local_400.release,local_586.release);
    if (iVar1 != 0) goto LAB_0017a4eb;
    iVar1 = strcmp(local_400.machine,local_586.machine);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    run_test_uname_cold_1();
LAB_0017a4d7:
    run_test_uname_cold_2();
LAB_0017a4dc:
    run_test_uname_cold_7();
LAB_0017a4e1:
    run_test_uname_cold_3();
LAB_0017a4e6:
    run_test_uname_cold_4();
LAB_0017a4eb:
    run_test_uname_cold_5();
  }
  run_test_uname_cold_6();
  puVar2 = uv_default_loop();
  puVar3 = &timer;
  puVar5 = (uv_timer_t *)puVar2;
  iVar1 = uv_timer_init(puVar2,&timer);
  if (iVar1 == 0) {
    puVar5 = &timer;
    pcVar4 = timer_cb;
    iVar1 = uv_timer_start(&timer,timer_cb,1,0);
    if (iVar1 != 0) goto LAB_0017a5c4;
    if (seen_timer_handle != 0) goto LAB_0017a5c9;
    pcVar4 = (code *)0x0;
    puVar5 = (uv_timer_t *)puVar2;
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_0017a5ce;
    if (seen_timer_handle != 1) goto LAB_0017a5d3;
    seen_timer_handle = 0;
    pcVar4 = walk_cb;
    uv_walk(puVar2,walk_cb,magic_cookie);
    if (seen_timer_handle == 0) {
      puVar2 = uv_default_loop();
      uv_walk(puVar2,close_walk_cb,(void *)0x0);
      pcVar4 = (code *)0x0;
      uv_run(puVar2,UV_RUN_DEFAULT);
      puVar2 = uv_default_loop();
      iVar1 = uv_loop_close(puVar2);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_0017a5dd;
    }
  }
  else {
    run_test_walk_handles_cold_1();
    pcVar4 = (code *)puVar3;
LAB_0017a5c4:
    run_test_walk_handles_cold_2();
LAB_0017a5c9:
    run_test_walk_handles_cold_3();
LAB_0017a5ce:
    run_test_walk_handles_cold_4();
LAB_0017a5d3:
    puVar2 = (uv_loop_t *)puVar5;
    run_test_walk_handles_cold_5();
  }
  run_test_walk_handles_cold_6();
LAB_0017a5dd:
  run_test_walk_handles_cold_7();
  if (puVar2 == (uv_loop_t *)&timer) {
    uv_walk(timer.loop,walk_cb,magic_cookie);
    uv_close((uv_handle_t *)&timer,(uv_close_cb)0x0);
    return extraout_EAX;
  }
  timer_cb_cold_1();
  if (pcVar4 == (code *)magic_cookie) {
    if (puVar2 == (uv_loop_t *)&timer) {
      seen_timer_handle = seen_timer_handle + 1;
      return extraout_EAX_00;
    }
  }
  else {
    walk_cb_cold_1();
  }
  walk_cb_cold_2();
  iVar1 = uv_is_closing((uv_handle_t *)puVar2);
  if (iVar1 != 0) {
    return iVar1;
  }
  uv_close((uv_handle_t *)puVar2,(uv_close_cb)0x0);
  return extraout_EAX_01;
}

Assistant:

TEST_IMPL(uname) {
#ifndef _WIN32
  struct utsname buf;
#endif
#ifdef _AIX
  char temp[256];
#endif
  uv_utsname_t buffer;
  int r;

  /* Verify that NULL is handled properly. */
  r = uv_os_uname(NULL);
  ASSERT(r == UV_EINVAL);

  /* Verify the happy path. */
  r = uv_os_uname(&buffer);
  ASSERT(r == 0);

#ifndef _WIN32
  ASSERT(uname(&buf) != -1);
  ASSERT(strcmp(buffer.sysname, buf.sysname) == 0);
  ASSERT(strcmp(buffer.version, buf.version) == 0);

# ifdef _AIX
  snprintf(temp, sizeof(temp), "%s.%s", buf.version, buf.release);
  ASSERT(strcmp(buffer.release, temp) == 0);
# else
  ASSERT(strcmp(buffer.release, buf.release) == 0);
# endif /* _AIX */

# if defined(_AIX) || defined(__PASE__)
  ASSERT(strcmp(buffer.machine, "ppc64") == 0);
# else
  ASSERT(strcmp(buffer.machine, buf.machine) == 0);
# endif /* defined(_AIX) || defined(__PASE__) */

#endif /* _WIN32 */

  return 0;
}